

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  atomic<unsigned_long> *paVar1;
  atomic<int> *paVar2;
  undefined4 *puVar3;
  long *plVar4;
  int iVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  BVH *pBVar12;
  ThreadLocal2 *this_01;
  Scene *pSVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  BuildRef *pBVar16;
  MutexSys *pMVar17;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar19;
  undefined4 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  ThreadLocal2 *this_02;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  long lVar31;
  ulong uVar32;
  float *pfVar33;
  ulong uVar34;
  long lVar35;
  size_t sVar36;
  ulong uVar37;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar38 [16];
  undefined1 extraout_var [56];
  undefined1 auVar39 [64];
  vuint<4> vgeomID;
  Lock<embree::MutexSys> lock;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  PrimRef *local_110;
  RefBuilderSmall *local_108;
  long *local_100;
  Lock<embree::MutexSys> local_f8;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  vuint<4> vprimID;
  PrimInfo pinfo;
  
  sVar36 = this->objectID_;
  pGVar11 = (topBuilder->scene->geometries).items[sVar36].ptr;
  uVar7 = pGVar11->numPrimitives;
  uVar37 = CONCAT44(0,uVar7);
  lVar31 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_130._0_8_ = lVar31 + 0x550;
  if (lVar31 == 0) {
    local_130._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_110 = (PrimRef *)0x0;
  local_130[8] = false;
  local_120 = (undefined1  [16])0x0;
  local_108 = this;
  if (uVar37 != 0) {
    sVar36 = uVar37 << 5;
    (**((MemoryMonitorInterface *)local_130._0_8_)->_vptr_MemoryMonitorInterface)
              (local_130._0_8_,sVar36,0);
    if (uVar7 < 0xe0000) {
      local_110 = (PrimRef *)alignedMalloc(sVar36,0x20);
    }
    else {
      local_110 = (PrimRef *)os_malloc(sVar36,(bool *)(local_130 + 8));
    }
    local_120._8_4_ = uVar7;
    local_120._0_8_ = uVar37;
    local_120._12_4_ = 0;
    sVar36 = local_108->objectID_;
  }
  avx::createPrimRefArray
            (&pinfo,pGVar11,(uint)sVar36,uVar37,(mvector<PrimRef> *)local_130,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  local_100 = (long *)__tls_get_addr(&PTR_021f8d38);
  auVar39._8_56_ = extraout_var;
  auVar39._0_8_ = extraout_XMM0_Qa;
  uVar37 = 0;
  do {
    auVar38 = auVar39._0_16_;
    if (pinfo.end - pinfo.begin <= uVar37) {
      uVar28 = local_120._8_8_;
      if (local_110 != (PrimRef *)0x0) {
        if ((ulong)(local_120._8_8_ << 5) < 0x1c00000) {
          alignedFree(local_110);
        }
        else {
          os_free(local_110,local_120._8_8_ << 5,local_130[8]);
        }
      }
      if (uVar28 != 0) {
        (***(_func_int ***)local_130._0_8_)(local_130._0_8_,uVar28 * -0x20,1);
      }
      return;
    }
    pBVar12 = topBuilder->bvh;
    this_02 = (ThreadLocal2 *)*local_100;
    if (this_02 == (ThreadLocal2 *)0x0) {
      this_02 = (ThreadLocal2 *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys((MutexSys *)this_02);
      (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
      (this_02->alloc0).parent = this_02;
      (this_02->alloc0).ptr = (char *)0x0;
      (this_02->alloc0).cur = 0;
      (this_02->alloc0).end = 0;
      (this_02->alloc0).allocBlockSize = 0;
      (this_02->alloc0).end = 0;
      (this_02->alloc0).allocBlockSize = 0;
      (this_02->alloc0).bytesUsed = 0;
      (this_02->alloc0).bytesWasted = 0;
      (this_02->alloc1).parent = this_02;
      (this_02->alloc1).ptr = (char *)0x0;
      (this_02->alloc1).cur = 0;
      (this_02->alloc1).end = 0;
      (this_02->alloc1).allocBlockSize = 0;
      (this_02->alloc1).end = 0;
      (this_02->alloc1).allocBlockSize = 0;
      (this_02->alloc1).bytesUsed = 0;
      (this_02->alloc1).bytesWasted = 0;
      *local_100 = (long)this_02;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      auVar38 = (undefined1  [16])0x0;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_f8.mutex = (MutexSys *)this_02;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&local_f8);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)&local_f8);
      Lock<embree::MutexSys>::~Lock(&lock);
    }
    this_00 = &pBVar12->alloc;
    uVar34 = (ulong)(((pBVar12->alloc).use_single_mode ^ 1) << 6);
    vgeomID.field_0.v[0] = 0xb0;
    this_01 = *(ThreadLocal2 **)((long)&(this_02->alloc0).parent + uVar34);
    if (this_00 != (this_01->alloc)._M_b._M_p) {
      local_f8.locked = true;
      local_f8.mutex = &this_01->mutex;
      MutexSys::lock(&this_01->mutex);
      if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((this_01->alloc0).end + (this_01->alloc1).end) -
             ((this_01->alloc0).cur + (this_01->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
        UNLOCK();
      }
      (this_01->alloc0).end = 0;
      (this_01->alloc0).allocBlockSize = 0;
      (this_01->alloc0).bytesUsed = 0;
      (this_01->alloc0).bytesWasted = 0;
      (this_01->alloc0).ptr = (char *)0x0;
      (this_01->alloc0).cur = 0;
      (this_01->alloc0).end = 0;
      (this_01->alloc0).allocBlockSize = 0;
      (this_01->alloc0).allocBlockSize = (pBVar12->alloc).defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = (pBVar12->alloc).defaultBlockSize;
      LOCK();
      (this_01->alloc)._M_b._M_p = this_00;
      UNLOCK();
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      auVar38 = (undefined1  [16])0x0;
      local_c8._M_head_impl = this_01;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(pBVar12->alloc).thread_local_allocators,&local_c8._M_head_impl);
      Lock<embree::MutexSys>::~Lock(&lock);
      Lock<embree::MutexSys>::~Lock(&local_f8);
    }
    plVar4 = (long *)((long)&(this_02->alloc0).bytesUsed + uVar34);
    *plVar4 = *plVar4 + vgeomID.field_0.v[0];
    lVar31 = *(long *)((long)&(this_02->alloc0).cur + uVar34);
    uVar32 = (ulong)(-(int)lVar31 & 0xf);
    uVar29 = lVar31 + vgeomID.field_0.v[0] + uVar32;
    *(ulong *)((long)&(this_02->alloc0).cur + uVar34) = uVar29;
    if (*(ulong *)((long)&(this_02->alloc0).end + uVar34) < uVar29) {
      *(long *)((long)&(this_02->alloc0).cur + uVar34) = lVar31;
      pMVar17 = *(MutexSys **)((long)&(this_02->alloc0).allocBlockSize + uVar34);
      if (pMVar17 < (MutexSys *)(vgeomID.field_0.v[0] << 2)) {
        pauVar30 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&vgeomID);
      }
      else {
        lock.mutex = pMVar17;
        pauVar30 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&lock);
        *(undefined1 (**) [16])((long)&(this_02->alloc0).ptr + uVar34) = pauVar30;
        lVar31 = (*(long *)((long)&(this_02->alloc0).end + uVar34) -
                 *(long *)((long)&(this_02->alloc0).cur + uVar34)) +
                 *(long *)((long)&(this_02->alloc0).bytesWasted + uVar34);
        *(long *)((long)&(this_02->alloc0).bytesWasted + uVar34) = lVar31;
        *(undefined8 *)((long)&(this_02->alloc0).cur + uVar34) = 0;
        *(MutexSys **)((long)&(this_02->alloc0).end + uVar34) = lock.mutex;
        *(longlong *)((long)&(this_02->alloc0).cur + uVar34) = vgeomID.field_0.v[0];
        if (lock.mutex < (ulong)vgeomID.field_0.v[0]) {
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar34) = 0;
          lock.mutex = *(MutexSys **)((long)&(this_02->alloc0).allocBlockSize + uVar34);
          pauVar30 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&lock);
          *(undefined1 (**) [16])((long)&(this_02->alloc0).ptr + uVar34) = pauVar30;
          lVar31 = (*(long *)((long)&(this_02->alloc0).end + uVar34) -
                   *(long *)((long)&(this_02->alloc0).cur + uVar34)) +
                   *(long *)((long)&(this_02->alloc0).bytesWasted + uVar34);
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar34) = lVar31;
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar34) = 0;
          *(MutexSys **)((long)&(this_02->alloc0).end + uVar34) = lock.mutex;
          *(longlong *)((long)&(this_02->alloc0).cur + uVar34) = vgeomID.field_0.v[0];
          if (lock.mutex < (ulong)vgeomID.field_0.v[0]) {
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar34) = 0;
            pauVar30 = (undefined1 (*) [16])0x0;
            goto LAB_00d37248;
          }
        }
        *(long *)((long)&(this_02->alloc0).bytesWasted + uVar34) = lVar31;
      }
    }
    else {
      plVar4 = (long *)((long)&(this_02->alloc0).bytesWasted + uVar34);
      *plVar4 = *plVar4 + uVar32;
      pauVar30 = (undefined1 (*) [16])
                 ((uVar29 - vgeomID.field_0._0_8_) +
                 *(long *)((long)&(this_02->alloc0).ptr + uVar34));
    }
LAB_00d37248:
    pSVar13 = topBuilder->bvh->scene;
    vgeomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar38,auVar38);
    uStack_148 = 0;
    uStack_140 = 0;
    lock.mutex = (MutexSys *)0x0;
    lock.locked = false;
    lock._9_7_ = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    uStack_d8 = 0;
    uStack_d0 = 0;
    local_f8.mutex = (MutexSys *)0x0;
    local_f8.locked = false;
    local_f8._9_7_ = 0;
    uStack_e8 = 0;
    uStack_e0 = 0;
    uStack_a8 = 0;
    uStack_a0 = 0;
    local_c8._M_head_impl = (ThreadLocal2 *)0x0;
    uStack_c0 = 0;
    uStack_b8 = 0;
    uStack_b0 = 0;
    pfVar33 = local_110[uVar37].upper.field_0.m128 + 3;
    vprimID.field_0 = vgeomID.field_0;
    for (uVar34 = 0; (uVar34 < 4 && (uVar37 + uVar34 < pinfo.end - pinfo.begin));
        uVar34 = uVar34 + 1) {
      fVar8 = pfVar33[-4];
      fVar9 = *pfVar33;
      pGVar11 = (pSVar13->geometries).items[(uint)fVar8].ptr;
      lVar35 = (ulong)(uint)fVar9 *
               pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar31 = *(long *)&pGVar11->field_0x58;
      lVar14 = *(long *)&pGVar11[1].time_range.upper;
      p_Var15 = pGVar11[1].intersectionFilterN;
      puVar3 = (undefined4 *)(lVar14 + (ulong)*(uint *)(lVar31 + lVar35) * (long)p_Var15);
      uVar10 = puVar3[1];
      uVar20 = puVar3[2];
      auVar38 = *(undefined1 (*) [16])
                 (lVar14 + (ulong)*(uint *)(lVar31 + 4 + lVar35) * (long)p_Var15);
      auVar6 = *(undefined1 (*) [16])
                (lVar14 + (ulong)*(uint *)(lVar31 + 8 + lVar35) * (long)p_Var15);
      *(undefined4 *)((long)&lock.mutex + uVar34 * 4) = *puVar3;
      *(undefined4 *)((long)&uStack_158 + uVar34 * 4) = uVar10;
      *(undefined4 *)((long)&uStack_148 + uVar34 * 4) = uVar20;
      *(int *)((long)&local_f8.mutex + uVar34 * 4) = auVar38._0_4_;
      uVar10 = vextractps_avx(auVar38,1);
      *(undefined4 *)((long)&uStack_e8 + uVar34 * 4) = uVar10;
      uVar10 = vextractps_avx(auVar38,2);
      *(undefined4 *)((long)&uStack_d8 + uVar34 * 4) = uVar10;
      *(int *)((long)&local_c8._M_head_impl + uVar34 * 4) = auVar6._0_4_;
      uVar10 = vextractps_avx(auVar6,1);
      *(undefined4 *)((long)&uStack_b8 + uVar34 * 4) = uVar10;
      uVar10 = vextractps_avx(auVar6,2);
      *(undefined4 *)((long)&uStack_a8 + uVar34 * 4) = uVar10;
      vgeomID.field_0.i[uVar34] = (uint)fVar8;
      vprimID.field_0.i[uVar34] = (uint)fVar9;
      pfVar33 = pfVar33 + 8;
    }
    auVar38[8] = lock.locked;
    auVar38._0_8_ = lock.mutex;
    auVar38._9_7_ = lock._9_7_;
    auVar6._8_8_ = uStack_150;
    auVar6._0_8_ = uStack_158;
    auVar21._8_8_ = uStack_140;
    auVar21._0_8_ = uStack_148;
    auVar22[8] = local_f8.locked;
    auVar22._0_8_ = local_f8.mutex;
    auVar22._9_7_ = local_f8._9_7_;
    auVar23._8_8_ = uStack_e0;
    auVar23._0_8_ = uStack_e8;
    auVar24._8_8_ = uStack_d0;
    auVar24._0_8_ = uStack_d8;
    auVar25._8_8_ = uStack_c0;
    auVar25._0_8_ = local_c8._M_head_impl;
    auVar26._8_8_ = uStack_b0;
    auVar26._0_8_ = uStack_b8;
    auVar27._8_8_ = uStack_a0;
    auVar27._0_8_ = uStack_a8;
    auVar38 = vmovntps_avx(auVar38);
    *pauVar30 = auVar38;
    auVar38 = vmovntps_avx(auVar6);
    pauVar30[1] = auVar38;
    auVar38 = vmovntps_avx(auVar21);
    pauVar30[2] = auVar38;
    auVar38 = vmovntps_avx(auVar22);
    pauVar30[3] = auVar38;
    auVar38 = vmovntps_avx(auVar23);
    pauVar30[4] = auVar38;
    auVar38 = vmovntps_avx(auVar24);
    pauVar30[5] = auVar38;
    auVar38 = vmovntps_avx(auVar25);
    pauVar30[6] = auVar38;
    auVar38 = vmovntps_avx(auVar26);
    pauVar30[7] = auVar38;
    auVar38 = vmovntps_avx(auVar27);
    pauVar30[8] = auVar38;
    auVar38 = vmovntps_avx((undefined1  [16])vgeomID.field_0);
    pauVar30[9] = auVar38;
    auVar38 = vmovntps_avx((undefined1  [16])vprimID.field_0);
    pauVar30[10] = auVar38;
    aVar18 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx((undefined1  [16])
                           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                           field_0,ZEXT416((uint)local_108->objectID_),0x30);
    auVar39 = ZEXT1664((undefined1  [16])aVar18);
    LOCK();
    paVar2 = &topBuilder->nextRef;
    iVar5 = (paVar2->super___atomic_base<int>)._M_i;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    aVar19 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx((undefined1  [16])
                           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                           field_0,ZEXT416(1),0x30);
    pBVar16 = (topBuilder->refs).items;
    pBVar16[iVar5].super_PrimRef.upper.field_0 = aVar19;
    pBVar16[iVar5].super_PrimRef.lower.field_0 = aVar18;
    pBVar16[iVar5].node.ptr = (ulong)pauVar30 | 9;
    pBVar16[iVar5].bounds_area = 0.0;
    uVar37 = uVar37 + uVar34;
  } while( true );
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }